

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O1

uint32_t volkGetInstanceVersion(void)

{
  uint in_EAX;
  VkResult VVar1;
  uint32_t apiVersion;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  if ((vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) &&
     (VVar1 = (*vkEnumerateInstanceVersion)((uint32_t *)((long)&uStack_8 + 4)), VVar1 == VK_SUCCESS)
     ) {
    return uStack_8._4_4_;
  }
  return (uint)(vkCreateInstance != (PFN_vkCreateInstance)0x0) << 0x16;
}

Assistant:

uint32_t volkGetInstanceVersion(void)
{
#if defined(VK_VERSION_1_1)
	uint32_t apiVersion = 0;
	if (vkEnumerateInstanceVersion && vkEnumerateInstanceVersion(&apiVersion) == VK_SUCCESS)
		return apiVersion;
#endif

	if (vkCreateInstance)
		return VK_API_VERSION_1_0;

	return 0;
}